

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::(anonymous_namespace)::TeeBranch> __thiscall
kj::heap<kj::(anonymous_namespace)::TeeBranch,kj::Own<kj::(anonymous_namespace)::AsyncTee>,int>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncTee> *params,int *params_1)

{
  AsyncTee *pAVar1;
  undefined8 *puVar2;
  TeeBranch *extraout_RDX;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  Own<kj::(anonymous_namespace)::TeeBranch> OVar6;
  Fault f;
  _Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> local_88;
  undefined8 local_38;
  
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = &PTR_read_0062b700;
  pAVar1 = params->ptr;
  params->ptr = (AsyncTee *)0x0;
  puVar2[1] = params->disposer;
  puVar2[2] = pAVar1;
  *(char *)(puVar2 + 3) = (char)params_1;
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)puVar2 + 0x1c));
  lVar4 = puVar2[2];
  uVar3 = (ulong)(((uint)params_1 & 0xff) * 0x60);
  if (*(char *)(lVar4 + 0x38 + uVar3) != '\x01') {
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_38 = 0;
    std::_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::
    _M_initialize_map(&local_88,0);
    lVar4 = lVar4 + uVar3;
    pcVar5 = (char *)(lVar4 + 0x38);
    local_38 = 0;
    if (*pcVar5 == '\x01') {
      *pcVar5 = '\0';
      std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
                ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)
                 (lVar4 + 0x40));
    }
    std::_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::
    _Deque_base((_Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *
                )(lVar4 + 0x40),&local_88);
    *(undefined8 *)(lVar4 + 0x90) = local_38;
    *pcVar5 = '\x01';
    std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
              ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)
               &local_88);
    *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::TeeBranch>::instance;
    *(undefined8 **)(this + 8) = puVar2;
    OVar6.ptr = extraout_RDX;
    OVar6.disposer = (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::TeeBranch>::instance;
    return OVar6;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
            ((Fault *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x4c1,FAILED,"branches[branch] == nullptr","\"branch already exists\"",
             (char (*) [22])"branch already exists");
  _::Debug::Fault::fatal((Fault *)&local_88);
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}